

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.cpp
# Opt level: O1

bool cv::imwrite(string *path,Mat *m,vector<int,_std::allocator<int>_> *params)

{
  uchar uVar1;
  pointer piVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  int in_ECX;
  long lVar5;
  uchar *puVar6;
  void *__child_stack;
  ulong uVar7;
  byte bVar8;
  void *in_R8;
  Mat img;
  string ext;
  Mat local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __s = strrchr((path->_M_dataplus)._M_p,0x2e);
  if (__s == (char *)0x0) {
    bVar8 = 0;
    goto LAB_0014a709;
  }
  local_50[0] = local_40;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,__s + sVar4);
  Mat::clone(&local_78,(__fn *)m,__child_stack,in_ECX,in_R8);
  if (local_78.c == 1) {
LAB_0014a5d3:
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if ((((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0)) ||
        (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0)) ||
       (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0)) {
      piVar2 = (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = 0x5f;
      lVar5 = (long)(params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2;
      if (lVar5 != 0) {
        uVar7 = 0;
        do {
          if (piVar2[uVar7] == 1) {
            iVar3 = piVar2[uVar7 + 1];
            break;
          }
          uVar7 = uVar7 + 2;
        } while (uVar7 < (ulong)(lVar5 >> 2));
      }
      iVar3 = stbi_write_jpg((path->_M_dataplus)._M_p,local_78.cols,local_78.rows,local_78.c,
                             local_78.data,iVar3);
      bVar8 = (byte)iVar3;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0)) {
        iVar3 = stbi_write_png((path->_M_dataplus)._M_p,local_78.cols,local_78.rows,local_78.c,
                               local_78.data,0);
        bVar8 = (byte)iVar3;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_50);
        if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 != 0))
        goto LAB_0014a693;
        iVar3 = stbi_write_bmp((path->_M_dataplus)._M_p,local_78.cols,local_78.rows,local_78.c,
                               local_78.data);
        bVar8 = (byte)iVar3;
      }
    }
  }
  else {
    if (local_78.c == 3) {
      if (0 < local_78.rows * local_78.cols) {
        iVar3 = 0;
        puVar6 = local_78.data;
        do {
          uVar1 = *puVar6;
          *puVar6 = puVar6[2];
          puVar6[2] = uVar1;
          puVar6 = puVar6 + 3;
          iVar3 = iVar3 + 1;
        } while (iVar3 < local_78.rows * local_78.cols);
      }
      goto LAB_0014a5d3;
    }
    if (local_78.c == 4) {
      if (0 < local_78.rows * local_78.cols) {
        lVar5 = 0;
        do {
          uVar1 = local_78.data[lVar5 * 4];
          local_78.data[lVar5 * 4] = local_78.data[lVar5 * 4 + 2];
          local_78.data[lVar5 * 4 + 2] = uVar1;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < local_78.rows * local_78.cols);
      }
      goto LAB_0014a5d3;
    }
LAB_0014a693:
    bVar8 = 0;
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if ((*local_78.refcount == 0) && (local_78.data != (uchar *)0x0)) {
      free(local_78.data);
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
LAB_0014a709:
  return (bool)(bVar8 & 1);
}

Assistant:

bool imwrite(const std::string& path, const Mat& m, const std::vector<int>& params)
{
    const char* _ext = strrchr(path.c_str(), '.');
    if (!_ext)
    {
        // missing extension
        return false;
    }

    std::string ext = _ext;
    Mat img = m.clone();

    // bgr to rgb
    int c = 0;
    if (img.type() == CV_8UC1)
    {
        c = 1;
    }
    else if (img.type() == CV_8UC3)
    {
        c = 3;
        uchar* p = img.data;
        for (int i = 0; i < img.cols * img.rows; i++)
        {
            std::swap(p[0], p[2]);
            p += 3;
        }
    }
    else if (img.type() == CV_8UC4)
    {
        c = 4;
        uchar* p = img.data;
        for (int i = 0; i < img.cols * img.rows; i++)
        {
            std::swap(p[0], p[2]);
            p += 4;
        }
    }
    else
    {
        // unexpected image channels
        return false;
    }

    bool success = false;

    if (ext == ".jpg" || ext == ".jpeg" || ext == ".JPG" || ext == ".JPEG")
    {
        int quality = 95;
        for (size_t i = 0; i < params.size(); i += 2)
        {
            if (params[i] == IMWRITE_JPEG_QUALITY)
            {
                quality = params[i + 1];
                break;
            }
        }
        success = stbi_write_jpg(path.c_str(), img.cols, img.rows, c, img.data, quality);
    }
    else if (ext == ".png" || ext == ".PNG")
    {
        success = stbi_write_png(path.c_str(), img.cols, img.rows, c, img.data, 0);
    }
    else if (ext == ".bmp" || ext == ".BMP")
    {
        success = stbi_write_bmp(path.c_str(), img.cols, img.rows, c, img.data);
    }
    else
    {
        // unknown extension type
        return false;
    }

    return success;
}